

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkLogicHasSimpleCos(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  int *__s;
  char *pcVar6;
  char *__s2;
  Abc_Obj_t *pAVar7;
  int Fill;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *extraout_RDX;
  long lVar9;
  int iVar10;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x3b1,"int Abc_NtkLogicHasSimpleCos(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar5 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar5 + 500;
    iVar10 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar10) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar10;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar5) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar10;
  }
  iVar5 = pNtk->nTravIds;
  pNtk->nTravIds = iVar5 + 1;
  if (0x3ffffffe < iVar5) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      pAVar7 = (Abc_Obj_t *)pVVar8->pArray[lVar9];
      if ((pAVar7->field_0x15 & 4) != 0) {
        return 0;
      }
      pAVar2 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
      uVar4 = *(uint *)&pAVar2->field_0x14 & 0xf;
      if ((uVar4 == 5) || (uVar4 == 2)) {
        pcVar6 = Abc_ObjName(pAVar2);
        __s2 = Abc_ObjName(pAVar7);
        iVar5 = strcmp(pcVar6,__s2);
        pVVar8 = extraout_RDX;
        if (iVar5 != 0) {
          return 0;
        }
      }
      pAVar3 = pAVar2->pNtk;
      iVar5 = pAVar2->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,(int)pVVar8);
      if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pAVar3->vTravIds).pArray[iVar5] == pAVar2->pNtk->nTravIds) {
        pAVar2 = pAVar2->pNext;
        pcVar6 = Abc_ObjName(pAVar7);
        iVar5 = strcmp((char *)pAVar2,pcVar6);
        if (iVar5 != 0) {
          return 0;
        }
      }
      else {
        pAVar7 = (Abc_Obj_t *)Abc_ObjName(pAVar7);
        pAVar2->pNext = pAVar7;
        pAVar3 = pAVar2->pNtk;
        iVar5 = pAVar2->Id;
        iVar10 = pAVar3->nTravIds;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
        if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar3->vTravIds).pArray[iVar5] = iVar10;
      }
      lVar9 = lVar9 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar9 < pVVar8->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkLogicHasSimpleCos( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pDriver;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        // if the driver is complemented, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjFaninC0(pNode) )
            return 0;
        // if the driver is a CI and has different name, this is an error
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
            return 0;
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
            return 0;
    }
    return 1;
}